

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void conv_decode_print_iter(correct_convolutional *conv,uint iter,uint winner_index)

{
  distance_t *pdVar1;
  uint j;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (iter < 0x8ac) {
    return;
  }
  printf("iteration: %d\n");
  pdVar1 = conv->errors->write_errors;
  puts("errors:");
  if (1 < conv->numstates) {
    uVar4 = 0;
    do {
      printf("%2d: %d\n",uVar4 & 0xffffffff,(ulong)pdVar1[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar4 < conv->numstates >> 1);
  }
  putchar(10);
  puts("history:");
  if (1 < conv->numstates) {
    uVar4 = 0;
    do {
      printf("%2d: ",uVar4 & 0xffffffff);
      uVar3 = 0;
      do {
        printf("%d",(ulong)(conv->history_buffer->history[uVar3][uVar4] != '\0'));
        uVar2 = (int)uVar3 + 1;
        uVar3 = (ulong)uVar2;
      } while (uVar2 <= winner_index);
      putchar(10);
      uVar4 = uVar4 + 1;
    } while (uVar4 < conv->numstates >> 1);
  }
  putchar(10);
  return;
}

Assistant:

void conv_decode_print_iter(correct_convolutional *conv, unsigned int iter,
                            unsigned int winner_index) {
    if (iter < 2220) {
        return;
    }
    printf("iteration: %d\n", iter);
    distance_t *errors = conv->errors->write_errors;
    printf("errors:\n");
    for (shift_register_t i = 0; i < conv->numstates / 2; i++) {
        printf("%2d: %d\n", i, errors[i]);
    }
    printf("\n");
    printf("history:\n");
    for (shift_register_t i = 0; i < conv->numstates / 2; i++) {
        printf("%2d: ", i);
        for (unsigned int j = 0; j <= winner_index; j++) {
            printf("%d", conv->history_buffer->history[j][i] ? 1 : 0);
        }
        printf("\n");
    }
    printf("\n");
}